

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O2

void __thiscall summarycalc::openpipe(summarycalc *this,int summary_id,string *pipe)

{
  int __status;
  bool bVar1;
  FILE *pFVar2;
  mapped_type *pmVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  int summary_id_local;
  string indexFileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  summary_id_local = summary_id;
  bVar1 = std::operator==(pipe,"-");
  if (bVar1) {
    this->fout[summary_id] = _stdout;
  }
  else {
    pFVar2 = fopen((pipe->_M_dataplus)._M_p,"wb");
    if (pFVar2 == (FILE *)0x0) {
      fprintf(_stderr,"FATAL: %s: Cannot open %s for output\n","openpipe",(pipe->_M_dataplus)._M_p);
      __status = -1;
      goto LAB_001032db;
    }
    this->fout[summary_id] = (FILE *)pFVar2;
    std::__cxx11::string::string((string *)&indexFileName,(string *)pipe);
    if (4 < pipe->_M_string_length) {
      std::__cxx11::string::substr((ulong)&local_38,(ulong)pipe);
      bVar1 = std::operator==(&local_38,".bin");
      std::__cxx11::string::~string((string *)&local_38);
      if (bVar1) {
        std::__cxx11::string::erase((ulong)&indexFileName,indexFileName._M_string_length - 4);
      }
    }
    std::__cxx11::string::append((char *)&indexFileName);
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->indexFiles,&summary_id_local);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    std::__cxx11::string::~string((string *)&indexFileName);
  }
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                    ((this->foutIndex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->foutIndex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&summary_id_local);
  if (_Var4._M_current ==
      (this->foutIndex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<int,_std::allocator<int>_>::push_back(&this->foutIndex_,&summary_id_local);
    return;
  }
  fprintf(_stderr,"FATAL: %s: Summary set ID %d requested at least twice\n","openpipe",
          (ulong)(uint)summary_id_local);
  __status = 1;
LAB_001032db:
  exit(__status);
}

Assistant:

void summarycalc::openpipe(int summary_id, const std::string &pipe)
{
	if (pipe == "-") fout[summary_id] = stdout;
	else {
		FILE *f = fopen(pipe.c_str(), "wb");
		if (f != nullptr) {
			fout[summary_id] = f;
			std::string indexFileName = pipe;
			if (pipe.length() > 4 && pipe.substr(pipe.length() - 4, 4) == ".bin") {
				indexFileName.erase(indexFileName.length() - 4);
			}
			indexFileName += ".idx";
			indexFiles[summary_id] = indexFileName;
		} else {
			fprintf(stderr, "FATAL: %s: Cannot open %s for output\n", __func__, pipe.c_str());
			::exit(-1);
		}
	}
	auto it = std::find(foutIndex_.begin(), foutIndex_.end(), summary_id);
	if (it != foutIndex_.end()) {
		fprintf(stderr, "FATAL: %s: Summary set ID %d requested at least twice\n",
			__func__, summary_id);
		exit(EXIT_FAILURE);
	}
	foutIndex_.push_back(summary_id);
}